

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

GPU_Target * GPU_LoadTarget(GPU_Image *image)

{
  GPU_Target *pGVar1;
  
  pGVar1 = GPU_GetTarget(image);
  if (pGVar1 != (GPU_Target *)0x0) {
    pGVar1->refcount = pGVar1->refcount + 1;
  }
  return pGVar1;
}

Assistant:

GPU_Target* GPU_LoadTarget(GPU_Image* image)
{
	GPU_Target* result = GPU_GetTarget(image);
	
	if(result != NULL)
        result->refcount++;
    
    return result;
}